

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

int __thiscall TPZMatrix<TFad<6,_double>_>::Decompose_LU(TPZMatrix<TFad<6,_double>_> *this)

{
  TFad<6,_double> *pTVar1;
  byte bVar2;
  int64_t iVar3;
  int64_t iVar4;
  TFad<6,_double> *e1;
  TFadExpr<TFadBinaryMinus<TFad<6,_double>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
  *fadexpr;
  TPZBaseMatrix *in_RDI;
  int64_t j;
  int64_t i;
  int64_t k;
  int64_t min;
  TFad<6,_double> pivot;
  TFad<6,_double> nn;
  TFad<6,_double> *in_stack_fffffffffffffd18;
  TFad<6,_double> *in_stack_fffffffffffffd20;
  TFad<6,_double> *in_stack_fffffffffffffd28;
  TFad<6,_double> *in_stack_fffffffffffffd30;
  undefined7 in_stack_fffffffffffffd50;
  long local_298;
  undefined1 local_270 [80];
  undefined1 local_220 [80];
  undefined1 local_1d0 [64];
  TFad<6,_double> *local_190;
  undefined1 local_188 [80];
  TFad<6,_double> *local_138;
  undefined1 local_130 [72];
  char *in_stack_ffffffffffffff18;
  char *in_stack_ffffffffffffff20;
  TFad<6,_double> *local_b0;
  undefined1 local_50 [76];
  int local_4;
  
  if ((in_RDI->fDecomposed != '\0') && (in_RDI->fDecomposed != '\x01')) {
    Error(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  }
  if (in_RDI->fDecomposed == '\0') {
    TFad<6,_double>::TFad(in_stack_fffffffffffffd20);
    TFad<6,_double>::TFad(in_stack_fffffffffffffd20);
    iVar3 = TPZBaseMatrix::Cols(in_RDI);
    iVar4 = TPZBaseMatrix::Rows(in_RDI);
    if (iVar3 < iVar4) {
      local_298 = TPZBaseMatrix::Cols(in_RDI);
    }
    else {
      local_298 = TPZBaseMatrix::Rows(in_RDI);
    }
    for (local_b0 = (TFad<6,_double> *)0x0; (long)local_b0 < local_298;
        local_b0 = (TFad<6,_double> *)((long)&(local_b0->super_TPZSavable)._vptr_TPZSavable + 1)) {
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_130,in_RDI,local_b0);
      e1 = TFad<6,_double>::operator=(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
      TFad<6,_double>::TFad(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
      bVar2 = IsZero<TFad<6,double>>(in_stack_fffffffffffffd20);
      TFad<6,_double>::~TFad((TFad<6,_double> *)0x1315fb7);
      TFad<6,_double>::~TFad((TFad<6,_double> *)0x1315fc4);
      pTVar1 = local_b0;
      if ((bVar2 & 1) != 0) {
        Error(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      }
      while( true ) {
        local_138 = (TFad<6,_double> *)((long)&(pTVar1->super_TPZSavable)._vptr_TPZSavable + 1);
        pTVar1 = local_138;
        fadexpr = (TFadExpr<TFadBinaryMinus<TFad<6,_double>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
                   *)TPZBaseMatrix::Rows(in_RDI);
        if ((long)fadexpr <= (long)pTVar1) break;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_188,in_RDI,local_138,local_b0);
        ::operator/(e1,(TFad<6,_double> *)CONCAT17(bVar2,in_stack_fffffffffffffd50));
        TFad<6,double>::operator=
                  (in_stack_fffffffffffffd30,
                   (TFadExpr<TFadBinaryDiv<TFad<6,_double>,_TFad<6,_double>_>_> *)
                   in_stack_fffffffffffffd28);
        TFadExpr<TFadBinaryDiv<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
                  ((TFadExpr<TFadBinaryDiv<TFad<6,_double>,_TFad<6,_double>_>_> *)0x1316113);
        TFad<6,_double>::~TFad((TFad<6,_double> *)0x1316120);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,local_138,local_b0,local_50);
        local_190 = local_b0;
        while( true ) {
          local_190 = (TFad<6,_double> *)((long)&(local_190->super_TPZSavable)._vptr_TPZSavable + 1)
          ;
          in_stack_fffffffffffffd30 = local_190;
          iVar3 = TPZBaseMatrix::Cols(in_RDI);
          pTVar1 = local_138;
          if (iVar3 <= (long)in_stack_fffffffffffffd30) break;
          in_stack_fffffffffffffd20 = local_138;
          in_stack_fffffffffffffd28 = local_190;
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_220);
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_270,in_RDI,local_b0,local_190);
          ::operator*(e1,(TFad<6,_double> *)CONCAT17(bVar2,in_stack_fffffffffffffd50));
          ::operator-(e1,(TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)
                         CONCAT17(bVar2,in_stack_fffffffffffffd50));
          TFad<6,double>::
          TFad<TFadBinaryMinus<TFad<6,double>,TFadExpr<TFadBinaryMul<TFad<6,double>,TFad<6,double>>>>>
                    ((TFad<6,_double> *)CONCAT17(bVar2,in_stack_fffffffffffffd50),fadexpr);
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])
                    (in_RDI,in_stack_fffffffffffffd20,in_stack_fffffffffffffd28,local_1d0);
          TFad<6,_double>::~TFad((TFad<6,_double> *)0x1316271);
          TFadExpr<TFadBinaryMinus<TFad<6,_double>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
          ::~TFadExpr((TFadExpr<TFadBinaryMinus<TFad<6,_double>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
                       *)0x131627e);
          TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
                    ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x131628b);
          TFad<6,_double>::~TFad((TFad<6,_double> *)0x1316295);
          TFad<6,_double>::~TFad((TFad<6,_double> *)0x13162a2);
        }
      }
    }
    in_RDI->fDecomposed = '\x01';
    local_4 = 1;
    TFad<6,_double>::~TFad((TFad<6,_double> *)0x131640a);
    TFad<6,_double>::~TFad((TFad<6,_double> *)0x1316417);
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int TPZMatrix<TVar>::Decompose_LU() {
	
	if (  fDecomposed && fDecomposed != ELU)  Error( "Decompose_LU <Matrix already Decomposed with other scheme>" );
	if (fDecomposed) return 1;
	
	TVar nn, pivot;
	int64_t  min = ( Cols() < (Rows()) ) ? Cols() : Rows();
	
	for ( int64_t k = 0; k < min ; k++ ) {
		if (IsZero( pivot = GetVal(k, k))) Error( "Decompose_LU <matrix is singular>" );
		for ( int64_t i = k+1; i < Rows(); i++ ) {
			nn = GetVal( i, k ) / pivot;
			PutVal( i, k, nn );
			for ( int64_t j = k+1; j < Cols(); j++ ) PutVal(i,j,GetVal(i,j)-nn*GetVal(k,j));
		}
	}
	fDecomposed=ELU;
	return 1;
}